

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O0

void __thiscall PSFFile::PSFFile(PSFFile *this)

{
  PSFFile *this_local;
  
  this->_vptr_PSFFile = (_func_int **)&PTR__PSFFile_00112d28;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->reserved);
  ZlibReader::ZlibReader(&this->compressed_exe);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->tags);
  return;
}

Assistant:

PSFFile::PSFFile()
{
}